

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void __thiscall
Encoder::CopyMaps<true>
          (Encoder *this,OffsetList **m_origInlineeFrameRecords,OffsetList **m_origInlineeFrameMap,
          OffsetList **m_origPragmaInstrToRecordOffset,OffsetList **m_origOffsetBuffer)

{
  Type TVar1;
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_03;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_04;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_05;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  Type *ppIVar6;
  Type *pTVar7;
  Type *ppPVar8;
  ulong uVar9;
  int iVar10;
  
  this_00 = this->m_inlineeFrameRecords;
  this_01 = this->m_inlineeFrameMap;
  this_02 = this->m_pragmaInstrToRecordOffset;
  if (((*m_origInlineeFrameRecords == (OffsetList *)0x0) ||
      (*m_origInlineeFrameMap == (OffsetList *)0x0)) ||
     (*m_origPragmaInstrToRecordOffset == (OffsetList *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x610,
                       "((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset))"
                       ,
                       "(*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset)"
                      );
    if (!bVar3) goto LAB_004112c5;
    *puVar4 = 0;
  }
  this_03 = *m_origInlineeFrameRecords;
  this_04 = *m_origInlineeFrameMap;
  this_05 = *m_origPragmaInstrToRecordOffset;
  if ((this_03->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count !=
      (this_00->super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x614,"(origRecList->Count() == recList->Count())",
                       "origRecList->Count() == recList->Count()");
    if (!bVar3) goto LAB_004112c5;
    *puVar4 = 0;
  }
  if ((this_04->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count !=
      (this_01->
      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x615,"(origMapList->Count() == mapList->Count())",
                       "origMapList->Count() == mapList->Count()");
    if (!bVar3) goto LAB_004112c5;
    *puVar4 = 0;
  }
  if ((this_05->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count !=
      (this_02->super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x616,"(origPInstrList->Count() == pInstrList->Count())",
                       "origPInstrList->Count() == pInstrList->Count()");
    if (!bVar3) goto LAB_004112c5;
    *puVar4 = 0;
  }
  if (m_origOffsetBuffer == (OffsetList **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x619,"(m_origOffsetBuffer)","m_origOffsetBuffer");
    if (!bVar3) goto LAB_004112c5;
    *puVar4 = 0;
  }
  if (((*m_origOffsetBuffer)->
      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count !=
      this->m_instrNumber) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x61a,"((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber)",
                       "(uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber");
    if (!bVar3) {
LAB_004112c5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (0 < (this_00->
          super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).count)
  {
    iVar10 = 0;
    do {
      pTVar5 = JsUtil::
               List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_03,iVar10);
      TVar1 = *pTVar5;
      ppIVar6 = JsUtil::
                List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar10);
      (*ppIVar6)->inlineeStartOffset = TVar1;
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this_00->
                      super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if (0 < (this_01->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count) {
    iVar10 = 0;
    do {
      pTVar5 = JsUtil::
               List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_04,iVar10);
      TVar1 = *pTVar5;
      pTVar7 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,iVar10);
      pTVar7->offset = TVar1;
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this_01->
                      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  if (0 < (this_02->super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count) {
    iVar10 = 0;
    do {
      pTVar5 = JsUtil::
               List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_05,iVar10);
      TVar1 = *pTVar5;
      ppPVar8 = JsUtil::
                List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,iVar10);
      (*ppPVar8)->m_offsetInBuffer = TVar1;
      iVar10 = iVar10 + 1;
    } while (iVar10 < (this_02->
                      super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count);
  }
  (*((*m_origInlineeFrameRecords)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  (*((*m_origInlineeFrameMap)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  (*((*m_origPragmaInstrToRecordOffset)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  *m_origInlineeFrameRecords = (OffsetList *)0x0;
  *m_origInlineeFrameMap = (OffsetList *)0x0;
  *m_origPragmaInstrToRecordOffset = (OffsetList *)0x0;
  if (this->m_instrNumber != 0) {
    uVar9 = 0;
    do {
      pTVar5 = JsUtil::
               List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(*m_origOffsetBuffer,(int)uVar9);
      this->m_offsetBuffer[uVar9] = *pTVar5;
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->m_instrNumber);
  }
  (*((*m_origOffsetBuffer)->
    super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList[1]
  )();
  *m_origOffsetBuffer = (OffsetList *)0x0;
  return;
}

Assistant:

void Encoder::CopyMaps(OffsetList **m_origInlineeFrameRecords
    , OffsetList **m_origInlineeFrameMap
    , OffsetList **m_origPragmaInstrToRecordOffset
    , OffsetList **m_origOffsetBuffer
    )
{
    InlineeFrameRecords *recList = m_inlineeFrameRecords;
    ArenaInlineeFrameMap *mapList = m_inlineeFrameMap;
    PragmaInstrList *pInstrList = m_pragmaInstrToRecordOffset;

    OffsetList *origRecList, *origMapList, *origPInstrList;
    if (!restore)
    {
        Assert(*m_origInlineeFrameRecords == nullptr);
        Assert(*m_origInlineeFrameMap == nullptr);
        Assert(*m_origPragmaInstrToRecordOffset == nullptr);

        *m_origInlineeFrameRecords = origRecList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origInlineeFrameMap = origMapList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
        *m_origPragmaInstrToRecordOffset = origPInstrList = Anew(m_tempAlloc, OffsetList, m_tempAlloc);

#if DBG_DUMP
        Assert((*m_origOffsetBuffer) == nullptr);
        *m_origOffsetBuffer = Anew(m_tempAlloc, OffsetList, m_tempAlloc);
#endif
    }
    else
    {
        Assert((*m_origInlineeFrameRecords) && (*m_origInlineeFrameMap) && (*m_origPragmaInstrToRecordOffset));
        origRecList = *m_origInlineeFrameRecords;
        origMapList = *m_origInlineeFrameMap;
        origPInstrList = *m_origPragmaInstrToRecordOffset;
        Assert(origRecList->Count() == recList->Count());
        Assert(origMapList->Count() == mapList->Count());
        Assert(origPInstrList->Count() == pInstrList->Count());

#if DBG_DUMP
        Assert(m_origOffsetBuffer);
        Assert((uint32)(*m_origOffsetBuffer)->Count() == m_instrNumber);
#endif
    }

    for (int i = 0; i < recList->Count(); i++)
    {
        if (!restore)
        {
            origRecList->Add(recList->Item(i)->inlineeStartOffset);
        }
        else
        {
            recList->Item(i)->inlineeStartOffset = origRecList->Item(i);
        }
    }

    for (int i = 0; i < mapList->Count(); i++)
    {
        if (!restore)
        {
            origMapList->Add(mapList->Item(i).offset);
        }
        else
        {
            mapList->Item(i).offset = origMapList->Item(i);
        }
    }

    for (int i = 0; i < pInstrList->Count(); i++)
    {
        if (!restore)
        {
            origPInstrList->Add(pInstrList->Item(i)->m_offsetInBuffer);
        }
        else
        {
            pInstrList->Item(i)->m_offsetInBuffer = origPInstrList->Item(i);
        }
    }

    if (restore)
    {
        (*m_origInlineeFrameRecords)->Delete();
        (*m_origInlineeFrameMap)->Delete();
        (*m_origPragmaInstrToRecordOffset)->Delete();
        (*m_origInlineeFrameRecords) = nullptr;
        (*m_origInlineeFrameMap) = nullptr;
        (*m_origPragmaInstrToRecordOffset) = nullptr;
    }

#if DBG_DUMP
    for (uint i = 0; i < m_instrNumber; i++)
    {
        if (!restore)
        {
            (*m_origOffsetBuffer)->Add(m_offsetBuffer[i]);
        }
        else
        {
            m_offsetBuffer[i] = (*m_origOffsetBuffer)->Item(i);
        }
    }

    if (restore)
    {
        (*m_origOffsetBuffer)->Delete();
        (*m_origOffsetBuffer) = nullptr;
    }
#endif
}